

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  int local_44;
  int local_40;
  int x;
  int i;
  int local_30;
  less<int> local_29;
  int n;
  map_bst<int,_int,_std::less<int>_> m;
  
  m.mSize._4_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::map_bst<int,_int,_std::less<int>_>::map_bst
            ((map_bst<int,_int,_std::less<int>_> *)&n,&local_29);
  std::istream::operator>>((istream *)&std::cin,&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Shallowest = ");
  iVar1 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
                    ((map_bst<int,_int,_std::less<int>_> *)&n);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_44);
    iVar1 = local_44;
    piVar3 = CP::map_bst<int,_int,_std::less<int>_>::operator[]
                       ((map_bst<int,_int,_std::less<int>_> *)&n,&local_44);
    *piVar3 = iVar1;
    poVar2 = std::operator<<((ostream *)&std::cout,"Shallowest = ");
    iVar1 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
                      ((map_bst<int,_int,_std::less<int>_> *)&n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst((map_bst<int,_int,_std::less<int>_> *)&n);
  return m.mSize._4_4_;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::map_bst<int,int> m;
  int n;
  std::cin >> n;
  std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  }




}